

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

bool __thiscall
Qentem::Value<char16_t>::
CopyValueTo<Qentem::StringStream<char16_t>,void(Qentem::StringStream<char16_t>&,char16_t_const*,unsigned_int)>
          (Value<char16_t> *this,StringStream<char16_t> *stream,RealFormatInfo format,
          _func_void_StringStream<char16_t>_ptr_char16_t_ptr_uint *string_function)

{
  Value<char16_t> *pVVar1;
  _func_void_StringStream<char16_t>_ptr_char16_t_ptr_uint *p_Var2;
  _func_void_StringStream<char16_t>_ptr_char16_t_ptr_uint *stream_00;
  ValueType VVar3;
  bool bVar4;
  SizeT SVar5;
  char16_t *pcVar6;
  RealFormatInfo local_40;
  RealFormatInfo local_38;
  _func_void_StringStream<char16_t>_ptr_char16_t_ptr_uint *local_30;
  _func_void_StringStream<char16_t>_ptr_char16_t_ptr_uint *string_function_local;
  StringStream<char16_t> *stream_local;
  Value<char16_t> *this_local;
  RealFormatInfo format_local;
  
  local_30 = string_function;
  string_function_local = (_func_void_StringStream<char16_t>_ptr_char16_t_ptr_uint *)stream;
  stream_local = (StringStream<char16_t> *)this;
  unique0x100001ec = format;
  VVar3 = Type(this);
  stream_00 = string_function_local;
  p_Var2 = local_30;
  switch(VVar3) {
  case ValuePtr:
    bVar4 = CopyValueTo<Qentem::StringStream<char16_t>,void(Qentem::StringStream<char16_t>&,char16_t_const*,unsigned_int)>
                      ((this->field_0).array_.storage_,
                       (StringStream<char16_t> *)string_function_local,stack0xffffffffffffffec,
                       local_30);
    return bVar4;
  default:
    return false;
  case String:
    if (local_30 == (_func_void_StringStream<char16_t>_ptr_char16_t_ptr_uint *)0x0) {
      pcVar6 = String<char16_t>::First((String<char16_t> *)this);
      SVar5 = String<char16_t>::Length((String<char16_t> *)this);
      StringStream<char16_t>::Write((StringStream<char16_t> *)stream_00,pcVar6,SVar5);
    }
    else {
      pcVar6 = String<char16_t>::First((String<char16_t> *)this);
      SVar5 = String<char16_t>::Length((String<char16_t> *)this);
      (*p_Var2)((StringStream<char16_t> *)stream_00,pcVar6,SVar5);
    }
    break;
  case UIntLong:
    pVVar1 = (this->field_0).array_.storage_;
    Digit::RealFormatInfo::RealFormatInfo(&local_38);
    Digit::NumberToString<false,Qentem::StringStream<char16_t>,unsigned_long_long>
              ((StringStream<char16_t> *)stream_00,(unsigned_long_long)pVVar1,local_38);
    break;
  case IntLong:
    pVVar1 = (this->field_0).array_.storage_;
    Digit::RealFormatInfo::RealFormatInfo(&local_40);
    Digit::NumberToString<false,Qentem::StringStream<char16_t>,long_long>
              ((StringStream<char16_t> *)stream_00,(longlong)pVVar1,local_40);
    break;
  case Double:
    Digit::NumberToString<false,Qentem::StringStream<char16_t>,double>
              ((StringStream<char16_t> *)string_function_local,
               (double)(this->field_0).array_.storage_,stack0xffffffffffffffec);
    break;
  case True:
    StringStream<char16_t>::Write((StringStream<char16_t> *)string_function_local,L"true",4);
    break;
  case False:
    StringStream<char16_t>::Write((StringStream<char16_t> *)string_function_local,L"false",5);
    break;
  case Null:
    StringStream<char16_t>::Write((StringStream<char16_t> *)string_function_local,L"null",4);
  }
  return true;
}

Assistant:

bool CopyValueTo(StringStream_T             &stream,
                     const Digit::RealFormatInfo format          = Digit::RealFormatInfo{Config::DoublePrecision},
                     StringFunction_T           *string_function = nullptr) const {
        switch (Type()) {
            case ValueType::String: {
                if (string_function != nullptr) {
                    string_function(stream, string_.First(), string_.Length());
                } else {
                    stream.Write(string_.First(), string_.Length());
                }

                break;
            }

            case ValueType::UIntLong: {
                Digit::NumberToString(stream, number_.Natural);
                break;
            }

            case ValueType::IntLong: {
                Digit::NumberToString(stream, number_.Integer);
                break;
            }

            case ValueType::Double: {
                Digit::NumberToString(stream, number_.Real, format);
                break;
            }

            case ValueType::True: {
                stream.Write(JSONotation::TrueString, JSONotation::TrueStringLength);
                break;
            }

            case ValueType::False: {
                stream.Write(JSONotation::FalseString, JSONotation::FalseStringLength);
                break;
            }

            case ValueType::Null: {
                stream.Write(JSONotation::NullString, JSONotation::NullStringLength);
                break;
            }

            case ValueType::ValuePtr: {
                return value_->CopyValueTo(stream, format, string_function);
            }

            default: {
                return false;
            }
        }

        return true;
    }